

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt.c
# Opt level: O2

_Bool COSE_Enveloped_decrypt(HCOSE_ENVELOPED h,HCOSE_RECIPIENT hRecip,cose_errback *perr)

{
  _Bool _Var1;
  
  _Var1 = IsValidEnvelopedHandle(h);
  if ((!_Var1) || (_Var1 = IsValidRecipientHandle(hRecip), !_Var1)) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_HANDLE;
    }
    return false;
  }
  if (*(long *)(h + 0x68) != 0) {
    _Var1 = _COSE_Enveloped_decrypt
                      ((COSE_Enveloped *)h,(COSE_RecipientInfo *)hRecip,(byte *)0x0,0,"Encrypt",perr
                      );
    return _Var1;
  }
  if (perr == (cose_errback *)0x0) {
    return false;
  }
  perr->err = COSE_ERR_INVALID_PARAMETER;
  return false;
}

Assistant:

bool COSE_Enveloped_decrypt(HCOSE_ENVELOPED h, HCOSE_RECIPIENT hRecip, cose_errback * perr)
{
	COSE_Enveloped * pcose = (COSE_Enveloped *)h;
	COSE_RecipientInfo * pRecip = (COSE_RecipientInfo *)hRecip;
	bool f = false;

	CHECK_CONDITION(IsValidEnvelopedHandle(h), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(IsValidRecipientHandle(hRecip), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(pcose->m_recipientFirst != NULL, COSE_ERR_INVALID_PARAMETER);

	f = _COSE_Enveloped_decrypt(pcose, pRecip, NULL, 0, "Encrypt", perr);

	errorReturn:
	return f;
}